

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O1

int __thiscall deqp::egl::RenderTests::init(RenderTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *eglTestCtx;
  TestNode *pTVar1;
  TestNode *node;
  MultiThreadRenderCase *this_00;
  RenderGroupSpec *pRVar2;
  pointer filters;
  FilterList local_78;
  vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> filterLists;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_context","Single-context rendering");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  createRenderGroups<deqp::egl::SingleThreadRenderCase>
            ((this->super_TestCaseGroup).m_eglTestCtx,(TestCaseGroup *)pTVar1,
             init::singleContextCases,init::multiContextCases);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "multi_context","Multi-context rendering with shared surface");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pRVar2 = init::multiContextCases;
  createRenderGroups<deqp::egl::SingleThreadRenderCase>
            ((this->super_TestCaseGroup).m_eglTestCtx,(TestCaseGroup *)pTVar1,
             init::multiContextCases,(RenderGroupSpec *)&SingleThreadRenderCase::typeinfo);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"multi_thread"
             ,"Multi-thread rendering with shared surface");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  eglTestCtx = (this->super_TestCaseGroup).m_eglTestCtx;
  do {
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,eglTestCtx->m_testCtx,pRVar2->name,pRVar2->desc);
    tcu::TestNode::addChild(pTVar1,node);
    filterLists.
    super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    filterLists.
    super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    filterLists.
    super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    eglu::FilterList::operator<<(&local_78,pRVar2->baseFilter);
    getDefaultRenderFilterLists(&filterLists,&local_78);
    for (filters = filterLists.
                   super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        filters !=
        filterLists.
        super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
        ._M_impl.super__Vector_impl_data._M_finish; filters = filters + 1) {
      this_00 = (MultiThreadRenderCase *)operator_new(0x1af0);
      MultiThreadRenderCase::MultiThreadRenderCase
                (this_00,eglTestCtx,(filters->super_NamedFilterList).m_name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,pRVar2->apiBits,filters->m_surfaceTypeMask
                 ,(FilterList *)filters,pRVar2->numContextsPerApi);
      tcu::TestNode::addChild(node,(TestNode *)this_00);
    }
    if (local_78.m_rules.
        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.m_rules.
                      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.m_rules.
                            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.m_rules.
                            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::~vector
              (&filterLists);
    pRVar2 = pRVar2 + 1;
  } while (pRVar2 != (RenderGroupSpec *)&SingleThreadRenderCase::typeinfo);
  return 0x215b9d8;
}

Assistant:

void RenderTests::init (void)
{
	static const RenderGroupSpec singleContextCases[] =
	{
		{
			"gles2",
			"Primitive rendering using GLES2",
			EGL_OPENGL_ES2_BIT,
			renderable<EGL_OPENGL_ES2_BIT>,
			1
		},
		{
			"gles3",
			"Primitive rendering using GLES3",
			EGL_OPENGL_ES3_BIT,
			renderable<EGL_OPENGL_ES3_BIT>,
			1
		},
	};

	static const RenderGroupSpec multiContextCases[] =
	{
		{
			"gles2",
			"Primitive rendering using multiple GLES2 contexts to shared surface",
			EGL_OPENGL_ES2_BIT,
			renderable<EGL_OPENGL_ES2_BIT>,
			3
		},
		{
			"gles3",
			"Primitive rendering using multiple GLES3 contexts to shared surface",
			EGL_OPENGL_ES3_BIT,
			renderable<EGL_OPENGL_ES3_BIT>,
			3
		},
		{
			"gles2_gles3",
			"Primitive rendering using multiple APIs to shared surface",
			EGL_OPENGL_ES2_BIT|EGL_OPENGL_ES3_BIT,
			renderable<EGL_OPENGL_ES2_BIT|EGL_OPENGL_ES3_BIT>,
			1
		},
	};

	tcu::TestCaseGroup* singleContextGroup = new tcu::TestCaseGroup(m_testCtx, "single_context", "Single-context rendering");
	addChild(singleContextGroup);
	createRenderGroups<SingleThreadRenderCase>(m_eglTestCtx, singleContextGroup, &singleContextCases[0], &singleContextCases[DE_LENGTH_OF_ARRAY(singleContextCases)]);

	tcu::TestCaseGroup* multiContextGroup = new tcu::TestCaseGroup(m_testCtx, "multi_context", "Multi-context rendering with shared surface");
	addChild(multiContextGroup);
	createRenderGroups<SingleThreadRenderCase>(m_eglTestCtx, multiContextGroup, &multiContextCases[0], &multiContextCases[DE_LENGTH_OF_ARRAY(multiContextCases)]);

	tcu::TestCaseGroup* multiThreadGroup = new tcu::TestCaseGroup(m_testCtx, "multi_thread", "Multi-thread rendering with shared surface");
	addChild(multiThreadGroup);
	createRenderGroups<MultiThreadRenderCase>(m_eglTestCtx, multiThreadGroup, &multiContextCases[0], &multiContextCases[DE_LENGTH_OF_ARRAY(multiContextCases)]);
}